

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O3

int cmdline_parser2(int argc,char **argv,gengetopt_args_info *args_info,int override,int initialize,
                   int check_required)

{
  int iVar1;
  undefined4 in_register_00000084;
  cmdline_parser_params params;
  cmdline_parser_params local_1c;
  
  local_1c.check_ambiguity = 0;
  local_1c.print_errors = 1;
  local_1c.override = override;
  local_1c.initialize = initialize;
  local_1c.check_required = check_required;
  iVar1 = cmdline_parser_internal
                    (argc,argv,args_info,&local_1c,(char *)CONCAT44(in_register_00000084,initialize)
                    );
  if (iVar1 != 1) {
    return iVar1;
  }
  cmdline_parser_free(args_info);
  exit(1);
}

Assistant:

int
cmdline_parser2 (int argc, char **argv, struct gengetopt_args_info *args_info, int override, int initialize, int check_required)
{
  int result;
  struct cmdline_parser_params params;
  
  params.override = override;
  params.initialize = initialize;
  params.check_required = check_required;
  params.check_ambiguity = 0;
  params.print_errors = 1;

  result = cmdline_parser_internal (argc, argv, args_info, &params, 0);

  if (result == EXIT_FAILURE)
    {
      cmdline_parser_free (args_info);
      exit (EXIT_FAILURE);
    }
  
  return result;
}